

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

void cali_push_snapshot(int param_1,int n,cali_id_t *trigger_info_attr_list,
                       cali_variant_t *trigger_info_val_list)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  Attribute AVar5;
  Channel *channel;
  pointer this;
  long lVar6;
  uint uVar7;
  SnapshotView trigger_info_00;
  Caliper c;
  Attribute attr [64];
  Variant data [64];
  FixedSizeSnapshotRecord<64UL> trigger_info;
  vector<cali::Channel,_std::allocator<cali::Channel>_> local_c90;
  Caliper local_c78;
  Attribute local_c58 [64];
  Variant local_a58 [64];
  Entry local_650 [64];
  SnapshotBuilder local_50;
  
  cali::Caliper::Caliper(&local_c78);
  memset(local_c58,0,0x200);
  memset(local_a58,0,0x400);
  uVar7 = 0;
  if (0 < n) {
    uVar7 = n;
  }
  uVar4 = 0x40;
  if ((int)uVar7 < 0x40) {
    uVar4 = uVar7;
  }
  if (0 < n) {
    lVar6 = 0;
    do {
      AVar5 = cali::Caliper::get_attribute
                        (&local_c78,*(cali_id_t *)((long)trigger_info_attr_list + lVar6));
      *(Node **)((long)&local_c58[0].m_node + lVar6) = AVar5.m_node;
      puVar1 = (undefined8 *)((long)&trigger_info_val_list->type_and_size + lVar6 * 2);
      uVar2 = puVar1[1];
      *(undefined8 *)((long)&local_a58[0].m_v.type_and_size + lVar6 * 2) = *puVar1;
      *(undefined8 *)((long)&local_a58[0].m_v.value + lVar6 * 2) = uVar2;
      lVar6 = lVar6 + 8;
    } while ((ulong)uVar4 * 8 - lVar6 != 0);
  }
  memset(local_650,0,0x600);
  local_50.m_capacity = 0x40;
  local_50.m_len = 0;
  local_50.m_skipped = 0;
  local_50.m_data = local_650;
  cali::Caliper::make_record(&local_c78,(ulong)uVar4,local_c58,local_a58,&local_50,(Node *)0x0);
  cali::Caliper::get_all_channels(&local_c90,&local_c78);
  if (local_c90.super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c90.super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = local_c90.super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
           super__Vector_impl_data._M_start;
    do {
      bVar3 = cali::Channel::is_active(this);
      if (bVar3) {
        trigger_info_00.m_len = local_50.m_len;
        trigger_info_00.m_data = local_50.m_data;
        cali::Caliper::push_snapshot
                  (&local_c78,
                   (this->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,trigger_info_00);
      }
      this = this + 1;
    } while (this != local_c90.super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<cali::Channel,_std::allocator<cali::Channel>_>::~vector(&local_c90);
  return;
}

Assistant:

void cali_push_snapshot(
    int /*scope*/,
    int                  n,
    const cali_id_t      trigger_info_attr_list[],
    const cali_variant_t trigger_info_val_list[]
)
{
    Caliper c;

    Attribute attr[64];
    Variant   data[64];

    n = std::min(std::max(n, 0), 64);

    for (int i = 0; i < n; ++i) {
        attr[i] = c.get_attribute(trigger_info_attr_list[i]);
        data[i] = Variant(trigger_info_val_list[i]);
    }

    FixedSizeSnapshotRecord<64> trigger_info;
    c.make_record(n, attr, data, trigger_info.builder());

    for (auto& channel : c.get_all_channels())
        if (channel.is_active())
            c.push_snapshot(channel.body(), trigger_info.view());
}